

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

load_stats_status_t *
Statistics::loadFromFileStatistics(load_stats_status_t *__return_storage_ptr__,string *filename)

{
  total_game_stats_t stats;
  ifstream statistics;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&statistics,(string *)filename,_S_in);
  if ((abStack_1f8[*(long *)(_statistics + -0x18)] & 5) == 0) {
    stats.totalDuration = 0.0;
    stats.winCount = 0;
    stats.bestScore = 0;
    stats.totalMoveCount = 0;
    stats.gameCount = 0;
    operator>>((istream *)&statistics,&stats);
    *(ulong *)&(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>
               ).super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
               super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.winCount =
         CONCAT44(stats._36_4_,stats.winCount);
    *(ulong *)&(__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>
               ).super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
               super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.gameCount =
         CONCAT44(stats._20_4_,stats.gameCount);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalDuration =
         stats.totalDuration;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.bestScore =
         stats.bestScore;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalMoveCount =
         stats.totalMoveCount;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Head_base<0UL,_bool,_false>._M_head_impl = true;
  }
  else {
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalDuration = 0.0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.winCount = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Head_base<0UL,_bool,_false>._M_head_impl = false;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.bestScore = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.totalMoveCount = 0;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_Statistics::total_game_stats_t>).
    super__Tuple_impl<1UL,_Statistics::total_game_stats_t>.
    super__Head_base<1UL,_Statistics::total_game_stats_t,_false>._M_head_impl.gameCount = 0;
  }
  std::ifstream::~ifstream(&statistics);
  return __return_storage_ptr__;
}

Assistant:

load_stats_status_t loadFromFileStatistics(std::string filename) {
  std::ifstream statistics(filename);
  if (statistics) {
    total_game_stats_t stats = generateStatsFromInputData(statistics);
    return load_stats_status_t{true, stats};
  }
  return load_stats_status_t{false, total_game_stats_t{}};
}